

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcolumn_bmod.c
# Opt level: O0

int dcolumn_bmod(int jcol,int nseg,double *dense,double *tempv,int *segrep,int *repfnz,int fpanelc,
                GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  flops_t *pfVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int_t iVar5;
  double *Mxvec;
  int local_144;
  int local_140;
  int local_13c;
  flops_t *ops;
  int_t mem_error;
  double none;
  double one;
  double zero;
  double *tempv1;
  int_t *piStack_100;
  int_t nzlumax;
  int_t *xlusup;
  double *lusup;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int d_fsupc;
  int fst_col;
  int_t nextlu;
  int_t ufirst;
  int_t new_next;
  int_t no_zeros;
  int_t i;
  int_t irow;
  int_t isub;
  int_t kfnz;
  int_t lptr;
  int ksupno;
  int krep_ind;
  int krep;
  int ksub;
  int k;
  int jsupno;
  int jcolp1;
  int nrow;
  int segsze;
  int nsupr;
  int nsupc;
  int fsupc;
  int_t luptr2;
  int_t luptr1;
  int_t luptr;
  double ukj2;
  double ukj1;
  double ukj;
  double beta;
  double alpha;
  int incy;
  int incx;
  int *repfnz_local;
  int *segrep_local;
  double *tempv_local;
  double *dense_local;
  int local_10;
  int nseg_local;
  int jcol_local;
  
  alpha._4_4_ = 1;
  alpha._0_4_ = 1;
  pfVar1 = stat->ops;
  supno = Glu->xsup;
  lsub = Glu->supno;
  xlsub = Glu->lsub;
  lusup = (double *)Glu->xlsub;
  xlusup = (int_t *)Glu->lusup;
  piStack_100 = Glu->xlusup;
  tempv1._4_4_ = Glu->nzlumax;
  k = jcol + 1;
  ksub = lsub[jcol];
  krep = nseg + -1;
  _incy = repfnz;
  repfnz_local = segrep;
  segrep_local = (int *)tempv;
  tempv_local = dense;
  dense_local._4_4_ = nseg;
  local_10 = jcol;
  for (krep_ind = 0; krep_ind < dense_local._4_4_; krep_ind = krep_ind + 1) {
    ksupno = repfnz_local[krep];
    krep = krep + -1;
    kfnz = lsub[ksupno];
    if (ksub != kfnz) {
      nsupr = supno[kfnz];
      local_13c = nsupr;
      if (nsupr <= fpanelc) {
        local_13c = fpanelc;
      }
      xsup._4_4_ = local_13c;
      xsup._0_4_ = local_13c - nsupr;
      iVar2 = piStack_100[local_13c] + (int)xsup;
      isub = *(int *)((long)lusup + (long)nsupr * 4) + (int)xsup;
      local_140 = _incy[ksupno];
      if (local_140 <= fpanelc) {
        local_140 = fpanelc;
      }
      irow = local_140;
      jcolp1 = (ksupno - local_140) + 1;
      iVar3 = ksupno - local_13c;
      segsze = iVar3 + 1;
      nrow = *(int *)((long)lusup + (long)(nsupr + 1) * 4) - *(int *)((long)lusup + (long)nsupr * 4)
      ;
      jsupno = (nrow - (int)xsup) - segsze;
      iVar4 = isub + segsze;
      lptr = iVar4 + -1;
      pfVar1[0x13] = (float)(jcolp1 * (ksupno - local_140)) + pfVar1[0x13];
      pfVar1[0x14] = (float)(jsupno * 2 * jcolp1) + pfVar1[0x14];
      if (jcolp1 == 1) {
        ukj1 = tempv_local[xlsub[lptr]];
        luptr2 = nrow * iVar3 + segsze + iVar2;
        for (new_next = isub + segsze; new_next < *(int *)((long)lusup + (long)(nsupr + 1) * 4);
            new_next = new_next + 1) {
          no_zeros = xlsub[new_next];
          tempv_local[no_zeros] =
               -ukj1 * *(double *)(xlusup + (long)luptr2 * 2) + tempv_local[no_zeros];
          luptr2 = luptr2 + 1;
        }
      }
      else if (jcolp1 < 4) {
        luptr2 = nrow * iVar3 + segsze + -1 + iVar2;
        ukj2 = tempv_local[xlsub[iVar4 + -2]];
        fsupc = luptr2 - nrow;
        if (jcolp1 == 2) {
          ukj1 = -ukj2 * *(double *)(xlusup + (long)fsupc * 2) + tempv_local[xlsub[lptr]];
          tempv_local[xlsub[lptr]] = ukj1;
          for (new_next = isub + segsze; new_next < *(int *)((long)lusup + (long)(nsupr + 1) * 4);
              new_next = new_next + 1) {
            no_zeros = xlsub[new_next];
            luptr2 = luptr2 + 1;
            fsupc = fsupc + 1;
            tempv_local[no_zeros] =
                 tempv_local[no_zeros] -
                 (ukj1 * *(double *)(xlusup + (long)luptr2 * 2) +
                 ukj2 * *(double *)(xlusup + (long)fsupc * 2));
          }
        }
        else {
          _luptr1 = tempv_local[xlsub[iVar4 + -3]];
          nsupc = fsupc - nrow;
          ukj2 = -_luptr1 * *(double *)(xlusup + (long)(nsupc + -1) * 2) + ukj2;
          ukj1 = -_luptr1 * *(double *)(xlusup + (long)nsupc * 2) +
                 -ukj2 * *(double *)(xlusup + (long)fsupc * 2) + tempv_local[xlsub[lptr]];
          tempv_local[xlsub[lptr]] = ukj1;
          tempv_local[xlsub[iVar4 + -2]] = ukj2;
          for (new_next = isub + segsze; new_next < *(int *)((long)lusup + (long)(nsupr + 1) * 4);
              new_next = new_next + 1) {
            no_zeros = xlsub[new_next];
            luptr2 = luptr2 + 1;
            fsupc = fsupc + 1;
            nsupc = nsupc + 1;
            tempv_local[no_zeros] =
                 tempv_local[no_zeros] -
                 (_luptr1 * *(double *)(xlusup + (long)nsupc * 2) +
                 ukj1 * *(double *)(xlusup + (long)luptr2 * 2) +
                 ukj2 * *(double *)(xlusup + (long)fsupc * 2));
          }
        }
      }
      else {
        ufirst = local_140 - local_13c;
        i = isub + ufirst;
        for (new_next = 0; new_next < jcolp1; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          *(double *)(segrep_local + (long)new_next * 2) = tempv_local[no_zeros];
          i = i + 1;
        }
        luptr2 = nrow * ufirst + ufirst + iVar2;
        dlsolve(nrow,jcolp1,(double *)(xlusup + (long)luptr2 * 2),(double *)segrep_local);
        luptr2 = jcolp1 + luptr2;
        Mxvec = (double *)(segrep_local + (long)jcolp1 * 2);
        dmatvec(nrow,jsupno,jcolp1,(double *)(xlusup + (long)luptr2 * 2),(double *)segrep_local,
                Mxvec);
        i = isub + ufirst;
        for (new_next = 0; new_next < jcolp1; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          tempv_local[no_zeros] = *(double *)(segrep_local + (long)new_next * 2);
          (segrep_local + (long)new_next * 2)[0] = 0;
          (segrep_local + (long)new_next * 2)[1] = 0;
          i = i + 1;
        }
        for (new_next = 0; new_next < jsupno; new_next = new_next + 1) {
          no_zeros = xlsub[i];
          tempv_local[no_zeros] = tempv_local[no_zeros] - Mxvec[new_next];
          Mxvec[new_next] = 0.0;
          i = i + 1;
        }
      }
    }
  }
  d_fsupc = piStack_100[local_10];
  nsupr = supno[ksub];
  nextlu = (d_fsupc + *(int *)((long)lusup + (long)(nsupr + 1) * 4)) -
           *(int *)((long)lusup + (long)nsupr * 4);
  while( true ) {
    if (nextlu <= tempv1._4_4_) {
      for (i = *(int_t *)((long)lusup + (long)nsupr * 4);
          i < *(int *)((long)lusup + (long)(nsupr + 1) * 4); i = i + 1) {
        no_zeros = xlsub[i];
        *(double *)(xlusup + (long)d_fsupc * 2) = tempv_local[no_zeros];
        tempv_local[no_zeros] = 0.0;
        d_fsupc = d_fsupc + 1;
      }
      piStack_100[k] = d_fsupc;
      if (fpanelc < nsupr) {
        local_144 = nsupr;
      }
      else {
        local_144 = fpanelc;
      }
      xsup._4_4_ = local_144;
      if (local_144 < local_10) {
        xsup._0_4_ = local_144 - nsupr;
        isub = *(int *)((long)lusup + (long)nsupr * 4) + (int)xsup;
        luptr2 = piStack_100[local_144] + (int)xsup;
        nrow = *(int *)((long)lusup + (long)(nsupr + 1) * 4) -
               *(int *)((long)lusup + (long)nsupr * 4);
        segsze = local_10 - local_144;
        jsupno = (nrow - (int)xsup) - segsze;
        fst_col = piStack_100[local_10] + (int)xsup;
        pfVar1[0x13] = (float)(segsze * (segsze + -1)) + pfVar1[0x13];
        pfVar1[0x14] = (float)(jsupno * 2 * segsze) + pfVar1[0x14];
        dlsolve(nrow,segsze,(double *)(xlusup + (long)luptr2 * 2),
                (double *)(xlusup + (long)fst_col * 2));
        dmatvec(nrow,jsupno,segsze,(double *)(xlusup + (long)(luptr2 + segsze) * 2),
                (double *)(xlusup + (long)fst_col * 2),(double *)segrep_local);
        i = fst_col + segsze;
        for (new_next = 0; new_next < jsupno; new_next = new_next + 1) {
          *(double *)(xlusup + (long)i * 2) =
               *(double *)(xlusup + (long)i * 2) - *(double *)(segrep_local + (long)new_next * 2);
          (segrep_local + (long)new_next * 2)[0] = 0;
          (segrep_local + (long)new_next * 2)[1] = 0;
          i = i + 1;
        }
      }
      return 0;
    }
    iVar5 = dLUMemXpand(local_10,d_fsupc,LUSUP,(int_t *)((long)&tempv1 + 4),Glu);
    if (iVar5 != 0) break;
    xlusup = (int_t *)Glu->lusup;
    xlsub = Glu->lsub;
  }
  return iVar5;
}

Assistant:

int
dcolumn_bmod (
	     const int  jcol,	  /* in */
	     const int  nseg,	  /* in */
	     double     *dense,	  /* in */
	     double     *tempv,	  /* working array */
	     int        *segrep,  /* in */
	     int        *repfnz,  /* in */
	     int        fpanelc,  /* in -- first column in the current panel */
	     GlobalLU_t *Glu,     /* modified */
	     SuperLUStat_t *stat  /* output */
	     )
{

#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
         ftcs2 = _cptofcd("N", strlen("N")),
         ftcs3 = _cptofcd("U", strlen("U"));
#endif
    int         incx = 1, incy = 1;
    double      alpha, beta;
    
    /* krep = representative of current k-th supernode
     * fsupc = first supernodal column
     * nsupc = no of columns in supernode
     * nsupr = no of rows in supernode (used as leading dimension)
     * luptr = location of supernodal LU-block in storage
     * kfnz = first nonz in the k-th supernodal segment
     * no_zeros = no of leading zeros in a supernodal U-segment
     */
    double      ukj, ukj1, ukj2;
    int_t        luptr, luptr1, luptr2;
    int          fsupc, nsupc, nsupr, segsze;
    int          nrow;	  /* No of rows in the matrix of matrix-vector */
    int          jcolp1, jsupno, k, ksub, krep, krep_ind, ksupno;
    int_t        lptr, kfnz, isub, irow, i;
    int_t        no_zeros, new_next, ufirst, nextlu;
    int          fst_col; /* First column within small LU update */
    int          d_fsupc; /* Distance between the first column of the current
			     panel and the first column of the current snode. */
    int          *xsup, *supno;
    int_t        *lsub, *xlsub;
    double       *lusup;
    int_t        *xlusup;
    int_t        nzlumax;
    double       *tempv1;
    double      zero = 0.0;
    double      one = 1.0;
    double      none = -1.0;
    int_t        mem_error;
    flops_t      *ops = stat->ops;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (double *) Glu->lusup;
    xlusup  = Glu->xlusup;
    nzlumax = Glu->nzlumax;
    jcolp1 = jcol + 1;
    jsupno = supno[jcol];
    
    /* 
     * For each nonz supernode segment of U[*,j] in topological order 
     */
    k = nseg - 1;
    for (ksub = 0; ksub < nseg; ksub++) {

	krep = segrep[k];
	k--;
	ksupno = supno[krep];
	if ( jsupno != ksupno ) { /* Outside the rectangular supernode */

	    fsupc = xsup[ksupno];
	    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

  	    /* Distance from the current supernode to the current panel; 
	       d_fsupc=0 if fsupc > fpanelc. */
  	    d_fsupc = fst_col - fsupc; 

	    luptr = xlusup[fst_col] + d_fsupc;
	    lptr = xlsub[fsupc] + d_fsupc;

	    kfnz = repfnz[krep];
	    kfnz = SUPERLU_MAX ( kfnz, fpanelc );

	    segsze = krep - kfnz + 1;
	    nsupc = krep - fst_col + 1;
	    nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	    nrow = nsupr - d_fsupc - nsupc;
	    krep_ind = lptr + nsupc - 1;

	    ops[TRSV] += segsze * (segsze - 1);
	    ops[GEMV] += 2 * nrow * segsze;


	    /* 
	     * Case 1: Update U-segment of size 1 -- col-col update 
	     */
	    if ( segsze == 1 ) {
	  	ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc;

		for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    irow = lsub[i];
		    dense[irow] -=  ukj*lusup[luptr];
		    luptr++;
		}

	    } else if ( segsze <= 3 ) {
		ukj = dense[lsub[krep_ind]];
		luptr += nsupr*(nsupc-1) + nsupc-1;
		ukj1 = dense[lsub[krep_ind - 1]];
		luptr1 = luptr - nsupr;

		if ( segsze == 2 ) { /* Case 2: 2cols-col update */
		    ukj -= ukj1 * lusup[luptr1];
		    dense[lsub[krep_ind]] = ukj;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
		    	dense[irow] -= ( ukj*lusup[luptr]
					+ ukj1*lusup[luptr1] );
		    }
		} else { /* Case 3: 3cols-col update */
		    ukj2 = dense[lsub[krep_ind - 2]];
		    luptr2 = luptr1 - nsupr;
		    ukj1 -= ukj2 * lusup[luptr2-1];
		    ukj = ukj - ukj1*lusup[luptr1] - ukj2*lusup[luptr2];
		    dense[lsub[krep_ind]] = ukj;
		    dense[lsub[krep_ind-1]] = ukj1;
		    for (i = lptr + nsupc; i < xlsub[fsupc+1]; ++i) {
		    	irow = lsub[i];
		    	luptr++;
		    	luptr1++;
			luptr2++;
		    	dense[irow] -= ( ukj*lusup[luptr]
			     + ukj1*lusup[luptr1] + ukj2*lusup[luptr2] );
		    }
		}



	    } else {
	  	/*
		 * Case: sup-col update
		 * Perform a triangular solve and block update,
		 * then scatter the result of sup-col update to dense
		 */

		no_zeros = kfnz - fst_col;

	        /* Copy U[*,j] segment from dense[*] to tempv[*] */
	        isub = lptr + no_zeros;
	        for (i = 0; i < segsze; i++) {
	  	    irow = lsub[isub];
		    tempv[i] = dense[irow];
		    ++isub; 
	        }

	        /* Dense triangular solve -- start effective triangle */
		luptr += nsupr * no_zeros + no_zeros; 
		
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		STRSV( ftcs1, ftcs2, ftcs3, &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#else		
		dtrsv_( "L", "N", "U", &segsze, &lusup[luptr], 
		       &nsupr, tempv, &incx );
#endif		
 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
                alpha = one;
                beta = zero;
#ifdef _CRAY
		SGEMV( ftcs2, &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#else
		dgemv_( "N", &nrow, &segsze, &alpha, &lusup[luptr], 
		       &nsupr, tempv, &incx, &beta, tempv1, &incy );
#endif
#else
		dlsolve ( nsupr, segsze, &lusup[luptr], tempv );

 		luptr += segsze;  /* Dense matrix-vector */
		tempv1 = &tempv[segsze];
		dmatvec (nsupr, nrow , segsze, &lusup[luptr], tempv, tempv1);
#endif
		
		
                /* Scatter tempv[] into SPA dense[] as a temporary storage */
                isub = lptr + no_zeros;
                for (i = 0; i < segsze; i++) {
                    irow = lsub[isub];
                    dense[irow] = tempv[i];
                    tempv[i] = zero;
                    ++isub;
                }

		/* Scatter tempv1[] into SPA dense[] */
		for (i = 0; i < nrow; i++) {
		    irow = lsub[isub];
		    dense[irow] -= tempv1[i];
		    tempv1[i] = zero;
		    ++isub;
		}
	    }
	    
	} /* if jsupno ... */

    } /* for each segment... */

    /*
     *	Process the supernodal portion of L\U[*,j]
     */
    nextlu = xlusup[jcol];
    fsupc = xsup[jsupno];

    /* Copy the SPA dense into L\U[*,j] */
    new_next = nextlu + xlsub[fsupc+1] - xlsub[fsupc];
    while ( new_next > nzlumax ) {
	mem_error = dLUMemXpand(jcol, nextlu, LUSUP, &nzlumax, Glu);
	if (mem_error) return (mem_error);
	lusup = (double *) Glu->lusup;
	lsub = Glu->lsub;
    }

    for (isub = xlsub[fsupc]; isub < xlsub[fsupc+1]; isub++) {
  	irow = lsub[isub];
	lusup[nextlu] = dense[irow];
        dense[irow] = zero;
	++nextlu;
    }

    xlusup[jcolp1] = nextlu;	/* Close L\U[*,jcol] */

    /* For more updates within the panel (also within the current supernode), 
     * should start from the first column of the panel, or the first column 
     * of the supernode, whichever is bigger. There are 2 cases:
     *    1) fsupc < fpanelc, then fst_col := fpanelc
     *    2) fsupc >= fpanelc, then fst_col := fsupc
     */
    fst_col = SUPERLU_MAX ( fsupc, fpanelc );

    if ( fst_col < jcol ) {

  	/* Distance between the current supernode and the current panel.
	   d_fsupc=0 if fsupc >= fpanelc. */
  	d_fsupc = fst_col - fsupc;

	lptr = xlsub[fsupc] + d_fsupc;
	luptr = xlusup[fst_col] + d_fsupc;
	nsupr = xlsub[fsupc+1] - xlsub[fsupc];	/* Leading dimension */
	nsupc = jcol - fst_col;	/* Excluding jcol */
	nrow = nsupr - d_fsupc - nsupc;

	/* Points to the beginning of jcol in snode L\U(jsupno) */
	ufirst = xlusup[jcol] + d_fsupc;	

	ops[TRSV] += nsupc * (nsupc - 1);
	ops[GEMV] += 2 * nrow * nsupc;
	
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
	STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#else
	dtrsv_( "L", "N", "U", &nsupc, &lusup[luptr], 
	       &nsupr, &lusup[ufirst], &incx );
#endif
	
	alpha = none; beta = one; /* y := beta*y + alpha*A*x */

#ifdef _CRAY
	SGEMV( ftcs2, &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#else
	dgemv_( "N", &nrow, &nsupc, &alpha, &lusup[luptr+nsupc], &nsupr,
	       &lusup[ufirst], &incx, &beta, &lusup[ufirst+nsupc], &incy );
#endif
#else
	dlsolve ( nsupr, nsupc, &lusup[luptr], &lusup[ufirst] );

	dmatvec ( nsupr, nrow, nsupc, &lusup[luptr+nsupc],
		&lusup[ufirst], tempv );
	
        /* Copy updates from tempv[*] into lusup[*] */
	isub = ufirst + nsupc;
	for (i = 0; i < nrow; i++) {
	    lusup[isub] -= tempv[i];
	    tempv[i] = 0.0;
	    ++isub;
	}

#endif
	
	
    } /* if fst_col < jcol ... */ 

    return 0;
}